

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-opt.cpp
# Opt level: O0

void ggml_opt_result_free(ggml_opt_result_t result)

{
  ggml_opt_result *in_RDI;
  
  if (in_RDI != (ggml_opt_result *)0x0) {
    ggml_opt_result::~ggml_opt_result(in_RDI);
    operator_delete(in_RDI,0x50);
  }
  return;
}

Assistant:

void ggml_opt_result_free(ggml_opt_result_t result) {
    delete result;
}